

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_makenode(atomic<unsigned_int> var,MTBDD low,MTBDD high)

{
  undefined8 local_28;
  MTBDD high_local;
  MTBDD low_local;
  atomic<unsigned_int> var_local;
  
  local_28 = low;
  if (low != high) {
    local_28 = _mtbdd_makenode((uint32_t)var.super___atomic_base<unsigned_int>._M_i,low,high);
  }
  return local_28;
}

Assistant:

MTBDD
_mtbdd_makenode(uint32_t var, MTBDD low, MTBDD high)
{
    // Normalization to keep canonicity
    // low will have no mark

    MTBDD result = low & mtbdd_complement;
    low ^= result;
    high ^= result;

    struct mtbddnode n;
    mtbddnode_makenode(&n, var, low, high);

    int created;
    uint64_t index = llmsset_lookup(nodes, n.a, n.b, &created);
    if (index == 0) {
        _mtbdd_makenode_gc(low, high);
        index = llmsset_lookup(nodes, n.a, n.b, &created);
        if (index == 0) _mtbdd_makenode_exit();
    }

    if (created) sylvan_stats_count(BDD_NODES_CREATED);
    else sylvan_stats_count(BDD_NODES_REUSED);

    result |= index;
    return result;
}